

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_key_share_entry(ptls_buffer_t *buf,uint16_t group,ptls_iovec_t pubkey)

{
  size_t sVar1;
  size_t sVar2;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  int local_28;
  uint16_t _v;
  int ret;
  uint16_t group_local;
  ptls_buffer_t *buf_local;
  ptls_iovec_t pubkey_local;
  
  pubkey_local.base = (uint8_t *)pubkey.len;
  buf_local = (ptls_buffer_t *)pubkey.base;
  capacity._4_1_ = (undefined1)(group >> 8);
  capacity._5_1_ = (undefined1)group;
  capacity._6_2_ = group;
  _v = group;
  _ret = buf;
  local_28 = ptls_buffer__do_pushv(buf,(void *)((long)&capacity + 4),2);
  if (local_28 == 0) {
    body_start = 2;
    local_28 = ptls_buffer__do_pushv(_ret,"",2);
    if (local_28 == 0) {
      sVar1 = _ret->off;
      local_28 = ptls_buffer__do_pushv(_ret,buf_local,(size_t)pubkey_local.base);
      if (local_28 == 0) {
        sVar2 = _ret->off;
        for (; body_start != 0; body_start = body_start - 1) {
          _ret->base[sVar1 - body_start] =
               (uint8_t)(sVar2 - sVar1 >> (((char)body_start + -1) * '\b' & 0x3fU));
        }
        local_28 = 0;
      }
    }
  }
  return local_28;
}

Assistant:

static int push_key_share_entry(ptls_buffer_t *buf, uint16_t group, ptls_iovec_t pubkey)
{
    int ret;

    ptls_buffer_push16(buf, group);
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, pubkey.base, pubkey.len); });
    ret = 0;
Exit:
    return ret;
}